

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O1

void Opa_ManMoveOne(Opa_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *pGVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  pGVar2 = p->pGia->pObjs;
  if ((((pObj < pGVar2) || (pGVar2 + p->pGia->nObjs <= pObj)) || (pFanin < pGVar2)) ||
     (pGVar2 + p->pGia->nObjs <= pFanin)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar11 = (int)((long)pFanin - (long)pGVar2 >> 2) * -0x55555555;
  if (iVar11 != 0) {
    iVar8 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    piVar3 = p->pId2Part;
    iVar7 = piVar3[iVar8];
    lVar10 = (long)iVar7;
    if (lVar10 < 0) {
      __assert_fail("p->pId2Part[ iObj ] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                    ,0x88,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    iVar1 = piVar3[iVar11];
    if ((long)iVar1 == -1) {
      piVar3[iVar11] = iVar7;
      Vec_IntPush(p->pvParts + piVar3[iVar8],iVar11);
      uVar6 = (uint)*(undefined8 *)pFanin;
      if (((uVar6 & 0x9fffffff) != 0x9fffffff) &&
         (((int)uVar6 < 0 || ((uVar6 & 0x1fffffff) == 0x1fffffff)))) {
        __assert_fail("Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                      ,0x8d,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
LAB_0071459d:
        Vec_IntPush(p->vFront,iVar11);
        return;
      }
      if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
        pGVar5 = p->pGia;
        uVar6 = (uint)((ulong)*(undefined8 *)pFanin >> 0x20);
        if (pGVar5->vCis->nSize - pGVar5->nRegs <= (int)(uVar6 & 0x1fffffff)) {
          uVar6 = uVar6 & 0x1fffffff;
          iVar11 = pGVar5->vCis->nSize;
          if ((int)uVar6 < iVar11 - pGVar5->nRegs) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar7 = pGVar5->vCos->nSize;
          uVar6 = (iVar7 - iVar11) + uVar6;
          if (((int)uVar6 < 0) || (iVar7 <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar11 = pGVar5->vCos->pArray[uVar6];
          lVar10 = (long)iVar11;
          if ((lVar10 < 0) || (pGVar5->nObjs <= iVar11)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          piVar3 = p->pId2Part;
          if (piVar3[lVar10] != -1) {
            __assert_fail("p->pId2Part[ iFanin ] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                          ,0x94,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
          }
          piVar3[lVar10] = piVar3[iVar8];
          Vec_IntPush(p->pvParts + piVar3[iVar8],iVar11);
          goto LAB_0071459d;
        }
      }
    }
    else if (iVar7 != iVar1) {
      pVVar4 = p->pvParts;
      if (pVVar4[lVar10].nSize < 1) {
        __assert_fail("Vec_IntSize(vPartObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCone.c"
                      ,0xa1,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      iVar7 = pVVar4[lVar10].nSize;
      if (0 < iVar7) {
        lVar9 = 0;
        do {
          iVar7 = pVVar4[lVar10].pArray[lVar9];
          Vec_IntPush(pVVar4 + iVar1,iVar7);
          p->pId2Part[iVar7] = p->pId2Part[iVar11];
          lVar9 = lVar9 + 1;
          iVar7 = pVVar4[lVar10].nSize;
        } while (lVar9 < iVar7);
      }
      if (iVar7 < 0) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar4[lVar10].nSize = 0;
      p->nParts = p->nParts + -1;
    }
  }
  return;
}

Assistant:

void Opa_ManMoveOne( Opa_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )
{
    int iObj   = Gia_ObjId(p->pGia, pObj);
    int iFanin = Gia_ObjId(p->pGia, pFanin);
    if ( iFanin == 0 )
        return;
    assert( p->pId2Part[ iObj ] >= 0 );
    if ( p->pId2Part[ iFanin ] == -1 )
    {
        p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
        Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
        assert( Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin) );
        if ( Gia_ObjIsAnd(pFanin) )
            Vec_IntPush( p->vFront, iFanin );
        else if ( Gia_ObjIsRo(p->pGia, pFanin) )
        {
            pFanin = Gia_ObjRoToRi(p->pGia, pFanin);
            iFanin = Gia_ObjId(p->pGia, pFanin);
            assert( p->pId2Part[ iFanin ] == -1 );
            p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
            Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
            Vec_IntPush( p->vFront, iFanin );
        }
    }
    else if ( p->pId2Part[ iObj ] != p->pId2Part[ iFanin ] )
    {
        Vec_Int_t * vPartObj = p->pvParts + p->pId2Part[ iObj ];
        Vec_Int_t * vPartFan = p->pvParts + p->pId2Part[ iFanin ];
        int iTemp, i;
//        printf( "Moving %d to %d (%d -> %d)\n", iObj, iFanin, Vec_IntSize(vPartObj), Vec_IntSize(vPartFan) );
        // add group of iObj to group of iFanin
        assert( Vec_IntSize(vPartObj) > 0 );
        Vec_IntForEachEntry( vPartObj, iTemp, i )
        {
            Vec_IntPush( vPartFan, iTemp );
            p->pId2Part[ iTemp ] = p->pId2Part[ iFanin ];
        }
        Vec_IntShrink( vPartObj, 0 );
        p->nParts--;
    }
}